

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O0

void convert_digit_sequence_for_numerical_reading(NJDNode *start,NJDNode *end)

{
  NJDNode *pNVar1;
  int iVar2;
  long in_RSI;
  _NJDNode *in_RDI;
  int have;
  int size;
  int index;
  int place;
  int digit;
  NJDNode *newnode;
  NJDNode *node;
  char *in_stack_000017f8;
  NJDNode *in_stack_00001800;
  undefined4 in_stack_ffffffffffffffc8;
  int acc;
  uint uVar3;
  int iVar4;
  int in_stack_ffffffffffffffdc;
  _NJDNode *local_18;
  
  iVar4 = 0;
  uVar3 = 0;
  acc = 0;
  for (local_18 = in_RDI; local_18 != *(_NJDNode **)(in_RSI + 0x70); local_18 = local_18->next) {
    uVar3 = uVar3 + 1;
  }
  if (1 < (int)uVar3) {
    iVar2 = (int)uVar3 % 4;
    if (iVar2 == 0) {
      iVar2 = 4;
    }
    if (iVar2 < (int)uVar3) {
      iVar4 = (int)(uVar3 - iVar2) / 4;
    }
    iVar2 = iVar2 + -1;
    local_18 = in_RDI;
    if (iVar4 < 0x12) {
      for (; local_18 != *(_NJDNode **)(in_RSI + 0x70); local_18 = local_18->next) {
        in_stack_ffffffffffffffdc =
             get_digit((NJDNode *)CONCAT44(in_stack_ffffffffffffffdc,iVar4),iVar2);
        if (iVar2 == 0) {
          if (in_stack_ffffffffffffffdc == 0) {
            NJDNode_set_pron((NJDNode *)(ulong)uVar3,(char *)CONCAT44(acc,in_stack_ffffffffffffffc8)
                            );
            NJDNode_set_acc((NJDNode *)CONCAT44(iVar2,uVar3),acc);
            NJDNode_set_mora_size((NJDNode *)CONCAT44(iVar2,uVar3),acc);
          }
          else {
            acc = 1;
          }
          if (acc == 1) {
            if (0 < iVar4) {
              pNVar1 = (NJDNode *)calloc(1,0x78);
              NJDNode_initialize(pNVar1);
              NJDNode_load(in_stack_00001800,in_stack_000017f8);
              local_18 = NJDNode_insert(pNVar1,(NJDNode *)CONCAT44(in_stack_ffffffffffffffdc,iVar4),
                                        (NJDNode *)CONCAT44(iVar2,uVar3));
            }
            acc = 0;
          }
          iVar4 = iVar4 + -1;
        }
        else if (in_stack_ffffffffffffffdc < 1) {
          NJDNode_set_pron((NJDNode *)CONCAT44(iVar2,uVar3),
                           (char *)CONCAT44(acc,in_stack_ffffffffffffffc8));
          NJDNode_set_acc((NJDNode *)CONCAT44(iVar2,uVar3),acc);
          NJDNode_set_mora_size((NJDNode *)CONCAT44(iVar2,uVar3),acc);
        }
        else {
          if (in_stack_ffffffffffffffdc == 1) {
            NJDNode_load(in_stack_00001800,in_stack_000017f8);
          }
          else {
            pNVar1 = (NJDNode *)calloc(1,0x78);
            NJDNode_initialize(pNVar1);
            NJDNode_load(in_stack_00001800,in_stack_000017f8);
            local_18 = NJDNode_insert(pNVar1,(NJDNode *)CONCAT44(in_stack_ffffffffffffffdc,iVar4),
                                      (NJDNode *)CONCAT44(iVar2,uVar3));
          }
          acc = 1;
        }
        iVar2 = iVar2 + -1;
        if (iVar2 < 0) {
          iVar2 = 3;
        }
      }
    }
  }
  return;
}

Assistant:

static void convert_digit_sequence_for_numerical_reading(NJDNode * start, NJDNode * end)
{
   NJDNode *node;
   NJDNode *newnode;
   int digit;
   int place = 0;
   int index;
   int size = 0;
   int have = 0;

   for (node = start; node != end->next; node = node->next)
      size++;
   if (size <= 1)
      return;

   index = size % 4;
   if (index == 0)
      index = 4;
   if (size > index)
      place = (size - index) / 4;
   index--;
   if (place > 17)
      return;

   for (node = start; node != end->next; node = node->next) {
      digit = get_digit(node, 0);
      if (index == 0) {
         if (digit == 0) {
            NJDNode_set_pron(node, NULL);
            NJDNode_set_acc(node, 0);
            NJDNode_set_mora_size(node, 0);
         } else {
            have = 1;
         }
         if (have == 1) {
            if (place > 0) {
               newnode = (NJDNode *) calloc(1, sizeof(NJDNode));
               NJDNode_initialize(newnode);
               NJDNode_load(newnode, (char *) njd_set_digit_rule_numeral_list3[place]);
               node = NJDNode_insert(node, node->next, newnode);
            }
            have = 0;
         }
         place--;
      } else {
         if (digit <= 0) {
            NJDNode_set_pron(node, NULL);
            NJDNode_set_acc(node, 0);
            NJDNode_set_mora_size(node, 0);
         } else if (digit == 1) {
            NJDNode_load(node, (char *) njd_set_digit_rule_numeral_list2[index]);
            have = 1;
         } else {
            newnode = (NJDNode *) calloc(1, sizeof(NJDNode));
            NJDNode_initialize(newnode);
            NJDNode_load(newnode, (char *) njd_set_digit_rule_numeral_list2[index]);
            node = NJDNode_insert(node, node->next, newnode);
            have = 1;
         }
      }
      index--;
      if (index < 0)
         index = 4 - 1;
   }
}